

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O3

void QtPrivate::
     QPrivateSlotObject<void_(QInputDialogPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
     ::impl(int which,QSlotObjectBase *this_,QObject *r,void **a,bool *ret)

{
  code *UNRECOVERED_JUMPTABLE;
  
  if (which == 2) {
    *ret = ((ImplFn)a[1] == this_[1].m_impl || *a == (void *)0x0) && *a == *(void **)(this_ + 1);
  }
  else {
    if (which == 1) {
      UNRECOVERED_JUMPTABLE = *(code **)(this_ + 1);
      if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
        UNRECOVERED_JUMPTABLE =
             *(code **)(UNRECOVERED_JUMPTABLE + *(long *)(this_[1].m_impl + *(long *)(r + 8)) + -1);
      }
      (*UNRECOVERED_JUMPTABLE)(this_[1].m_impl + *(long *)(r + 8),a[1],a[2],a,UNRECOVERED_JUMPTABLE)
      ;
      return;
    }
    if (which == 0) {
      operator_delete(this_,0x20);
      return;
    }
  }
  return;
}

Assistant:

static void impl(QSlotObjectBase *this_, QObject *r, void **a, int which, bool *ret)
#endif
    {
        const auto that = static_cast<QPrivateSlotObject*>(this_);
        switch (which) {
            case Destroy:
                delete that;
                break;
            case Call:
                FuncType::template call<Args, R>(that->object(),
                                                 static_cast<typename FuncType::Object *>(QObjectPrivate::get(r)), a);
                break;
            case Compare:
                *ret = *reinterpret_cast<Func *>(a) == that->object();
                break;
            case NumOperations: ;
        }
    }